

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  vfloat<4> vVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  BVH *bvh;
  size_t sVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  long lVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char cVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  size_t sVar29;
  uint uVar30;
  undefined4 uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  size_t sVar35;
  long lVar36;
  long lVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined8 *puVar46;
  NodeRef *pNVar47;
  ulong uVar48;
  NodeRef root;
  ulong uVar49;
  bool bVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 in_ZMM0 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar122;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar123;
  float fVar138;
  float fVar139;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar140;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar141;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar170;
  float fVar173;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar175;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar171;
  undefined1 auVar158 [16];
  float fVar172;
  float fVar174;
  float fVar176;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar209;
  float fVar211;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar213;
  undefined1 auVar207 [16];
  float fVar210;
  float fVar212;
  float fVar214;
  undefined1 auVar208 [16];
  float fVar215;
  float fVar225;
  float fVar226;
  undefined1 auVar216 [16];
  float fVar228;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar227;
  float fVar229;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar238;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar239;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar248;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  float fVar247;
  undefined1 auVar245 [64];
  float fVar249;
  float fVar250;
  float fVar261;
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar265;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar262;
  undefined1 auVar257 [16];
  float fVar264;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  float fVar272;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar271;
  undefined1 auVar270 [64];
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar276 [64];
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar287;
  undefined1 auVar283 [16];
  undefined1 auVar285 [12];
  float fVar288;
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar290 [16];
  float fVar296;
  float local_1c48;
  float fStack_1c44;
  float fStack_1c40;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float local_1c28;
  float fStack_1c24;
  float fStack_1c20;
  Precalculations pre;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  vfloat<4> lower_y;
  vfloat<4> lower_z;
  vbool<4> terminated;
  undefined1 local_1b38 [8];
  float fStack_1b30;
  float fStack_1b2c;
  vfloat<4> upper_z;
  vfloat<4> upper_x;
  vfloat<4> t;
  vfloat<4> v;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  TravRayK<4,_true> tray;
  vfloat<4> upper_y;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  vfloat<4> lower_x;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined1 local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar60 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar124 = vpcmpeqd_avx(auVar60,(undefined1  [16])valid_i->field_0);
    auVar105 = ZEXT816(0) << 0x40;
    auVar18 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar105,5);
    auVar145 = auVar124 & auVar18;
    if ((((auVar145 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar145 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar145 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar145[0xf] < '\0'
       ) {
      auVar18 = vandps_avx(auVar18,auVar124);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar92._8_4_ = 0x7fffffff;
      auVar92._0_8_ = 0x7fffffff7fffffff;
      auVar92._12_4_ = 0x7fffffff;
      auVar124 = vandps_avx(auVar92,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar230._8_4_ = 0x219392ef;
      auVar230._0_8_ = 0x219392ef219392ef;
      auVar230._12_4_ = 0x219392ef;
      auVar145 = vcmpps_avx(auVar124,auVar230,1);
      auVar251._8_4_ = 0x3f800000;
      auVar251._0_8_ = 0x3f8000003f800000;
      auVar251._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar251,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar124 = vandps_avx(auVar92,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar82 = vcmpps_avx(auVar124,auVar230,1);
      auVar81 = vdivps_avx(auVar251,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar124 = vandps_avx(auVar92,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar124 = vcmpps_avx(auVar124,auVar230,1);
      auVar231._8_4_ = 0x5d5e0b6b;
      auVar231._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar231._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar95,auVar231,auVar145)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar81,auVar231,auVar82);
      auVar145 = vdivps_avx(auVar251,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar145,auVar231,auVar124);
      auVar124 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar105,1);
      auVar95._8_4_ = 0x10;
      auVar95._0_8_ = 0x1000000010;
      auVar95._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar124,auVar95);
      auVar124 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar105,5);
      auVar145._8_4_ = 0x20;
      auVar145._0_8_ = 0x2000000020;
      auVar145._12_4_ = 0x20;
      auVar81._8_4_ = 0x30;
      auVar81._0_8_ = 0x3000000030;
      auVar81._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar81,auVar145,auVar124);
      auVar124 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar105,5);
      auVar82._8_4_ = 0x40;
      auVar82._0_8_ = 0x4000000040;
      auVar82._12_4_ = 0x40;
      auVar91._8_4_ = 0x50;
      auVar91._0_8_ = 0x5000000050;
      auVar91._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar91,auVar82,auVar124)
      ;
      auVar124 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar105);
      auVar145 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar105);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar260 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar124,auVar18);
      auVar103 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar124._8_4_ = 0xff800000;
      auVar124._0_8_ = 0xff800000ff800000;
      auVar124._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar124,auVar145,auVar18);
      terminated.field_0.i[1] = auVar18._4_4_ ^ auVar60._4_4_;
      terminated.field_0.i[0] = auVar18._0_4_ ^ auVar60._0_4_;
      terminated.field_0.i[2] = auVar18._8_4_ ^ auVar60._8_4_;
      terminated.field_0.i[3] = auVar18._12_4_ ^ auVar60._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar39 = 3;
      }
      else {
        uVar39 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar47 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar270 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_00ed6654:
      do {
        do {
          root.ptr = pNVar47[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ed8198;
          pNVar47 = pNVar47 + -1;
          paVar38 = paVar38 + -1;
          vVar6.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar38->v;
          auVar276 = ZEXT1664((undefined1  [16])vVar6.field_0);
          auVar60 = vcmpps_avx((undefined1  [16])vVar6.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar30 = vmovmskps_avx(auVar60);
        } while (uVar30 == 0);
        uVar49 = (ulong)(uVar30 & 0xff);
        uVar30 = POPCOUNT(uVar30 & 0xff);
        if (uVar39 < uVar30) {
LAB_00ed6698:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ed8198;
              auVar60 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar276._0_16_,6);
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                uVar49 = root.ptr & 0xfffffffffffffff0;
                auVar60 = vpcmpeqd_avx(auVar60,auVar60);
                auVar276 = ZEXT1664(auVar60 ^ (undefined1  [16])terminated.field_0);
                for (lVar33 = 0; lVar33 != (ulong)((uint)root.ptr & 0xf) - 8; lVar33 = lVar33 + 1) {
                  lVar36 = lVar33 * 0x58;
                  auVar59._8_8_ = 0;
                  auVar59._0_8_ = *(ulong *)(uVar49 + 0x20 + lVar36);
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = *(ulong *)(uVar49 + 0x24 + lVar36);
                  auVar124 = vpminub_avx(auVar59,auVar86);
                  auVar60 = vpcmpeqb_avx(auVar59,auVar124);
                  auVar124 = vpcmpeqd_avx(auVar124,auVar124);
                  auVar103 = ZEXT1664(auVar124);
                  auVar60 = vpmovzxbd_avx(auVar60 ^ auVar124);
                  auVar60 = vpslld_avx(auVar60 ^ auVar124,0x1f);
                  iVar32 = vmovmskps_avx(auVar60);
                  if (iVar32 != 0) {
                    lVar36 = lVar36 + uVar49;
                    uVar40 = (ulong)(byte)iVar32;
                    do {
                      auVar60 = auVar276._0_16_;
                      lVar16 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                        }
                      }
                      auVar61._8_8_ = 0;
                      auVar61._0_8_ = *(ulong *)(lVar36 + 0x20);
                      auVar124 = vpmovzxbd_avx(auVar61);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      fVar240 = *(float *)(lVar36 + 0x44);
                      fVar246 = *(float *)(lVar36 + 0x38);
                      lower_x.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      lower_x.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      lower_x.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      lower_x.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      auVar62._8_8_ = 0;
                      auVar62._0_8_ = *(ulong *)(lVar36 + 0x24);
                      auVar124 = vpmovzxbd_avx(auVar62);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      upper_x.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      upper_x.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      upper_x.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      upper_x.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      auVar63._8_8_ = 0;
                      auVar63._0_8_ = *(ulong *)(lVar36 + 0x28);
                      auVar124 = vpmovzxbd_avx(auVar63);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      fVar240 = *(float *)(lVar36 + 0x48);
                      fVar246 = *(float *)(lVar36 + 0x3c);
                      lower_y.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      lower_y.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      lower_y.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      lower_y.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = *(ulong *)(lVar36 + 0x2c);
                      auVar124 = vpmovzxbd_avx(auVar64);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      upper_y.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      upper_y.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      upper_y.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      upper_y.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = *(ulong *)(lVar36 + 0x30);
                      auVar124 = vpmovzxbd_avx(auVar65);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      fVar240 = *(float *)(lVar36 + 0x4c);
                      fVar246 = *(float *)(lVar36 + 0x40);
                      lower_z.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      lower_z.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      lower_z.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      lower_z.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = *(ulong *)(lVar36 + 0x34);
                      auVar124 = vpmovzxbd_avx(auVar66);
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      upper_z.field_0.v[0] = fVar246 + fVar240 * auVar124._0_4_;
                      upper_z.field_0.v[1] = fVar246 + fVar240 * auVar124._4_4_;
                      upper_z.field_0.v[2] = fVar246 + fVar240 * auVar124._8_4_;
                      upper_z.field_0.v[3] = fVar246 + fVar240 * auVar124._12_4_;
                      iVar32 = lower_x.field_0.i[lVar16];
                      auVar67._4_4_ = iVar32;
                      auVar67._0_4_ = iVar32;
                      auVar67._8_4_ = iVar32;
                      auVar67._12_4_ = iVar32;
                      auVar22._8_8_ = tray.org.field_0._8_8_;
                      auVar22._0_8_ = tray.org.field_0._0_8_;
                      auVar23._8_8_ = tray.org.field_0._24_8_;
                      auVar23._0_8_ = tray.org.field_0._16_8_;
                      auVar24._8_8_ = tray.org.field_0._40_8_;
                      auVar24._0_8_ = tray.org.field_0._32_8_;
                      auVar124 = vsubps_avx(auVar67,auVar22);
                      auVar68._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar124._0_4_;
                      auVar68._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar124._4_4_;
                      auVar68._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar124._8_4_;
                      auVar68._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar124._12_4_;
                      iVar32 = lower_y.field_0.i[lVar16];
                      auVar179._4_4_ = iVar32;
                      auVar179._0_4_ = iVar32;
                      auVar179._8_4_ = iVar32;
                      auVar179._12_4_ = iVar32;
                      auVar124 = vsubps_avx(auVar179,auVar23);
                      auVar180._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar124._0_4_;
                      auVar180._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar124._4_4_;
                      auVar180._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar124._8_4_;
                      auVar180._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar124._12_4_;
                      iVar32 = lower_z.field_0.i[lVar16];
                      auVar204._4_4_ = iVar32;
                      auVar204._0_4_ = iVar32;
                      auVar204._8_4_ = iVar32;
                      auVar204._12_4_ = iVar32;
                      auVar124 = vsubps_avx(auVar204,auVar24);
                      auVar205._0_4_ = (float)tray.rdir.field_0._32_4_ * auVar124._0_4_;
                      auVar205._4_4_ = (float)tray.rdir.field_0._36_4_ * auVar124._4_4_;
                      auVar205._8_4_ = (float)tray.rdir.field_0._40_4_ * auVar124._8_4_;
                      auVar205._12_4_ = (float)tray.rdir.field_0._44_4_ * auVar124._12_4_;
                      iVar32 = upper_x.field_0.i[lVar16];
                      auVar233._4_4_ = iVar32;
                      auVar233._0_4_ = iVar32;
                      auVar233._8_4_ = iVar32;
                      auVar233._12_4_ = iVar32;
                      auVar124 = vsubps_avx(auVar233,auVar22);
                      auVar87._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar124._0_4_;
                      auVar87._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar124._4_4_;
                      auVar87._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar124._8_4_;
                      auVar87._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar124._12_4_;
                      iVar32 = upper_y.field_0.i[lVar16];
                      auVar146._4_4_ = iVar32;
                      auVar146._0_4_ = iVar32;
                      auVar146._8_4_ = iVar32;
                      auVar146._12_4_ = iVar32;
                      auVar124 = vsubps_avx(auVar146,auVar23);
                      auVar107._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar124._0_4_;
                      auVar107._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar124._4_4_;
                      auVar107._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar124._8_4_;
                      auVar107._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar124._12_4_;
                      iVar32 = upper_z.field_0.i[lVar16];
                      auVar147._4_4_ = iVar32;
                      auVar147._0_4_ = iVar32;
                      auVar147._8_4_ = iVar32;
                      auVar147._12_4_ = iVar32;
                      auVar124 = vsubps_avx(auVar147,auVar24);
                      auVar126._0_4_ = (float)tray.rdir.field_0._32_4_ * auVar124._0_4_;
                      auVar126._4_4_ = (float)tray.rdir.field_0._36_4_ * auVar124._4_4_;
                      auVar126._8_4_ = (float)tray.rdir.field_0._40_4_ * auVar124._8_4_;
                      auVar126._12_4_ = (float)tray.rdir.field_0._44_4_ * auVar124._12_4_;
                      auVar124 = vminps_avx(auVar68,auVar87);
                      auVar145 = vminps_avx(auVar180,auVar107);
                      auVar124 = vmaxps_avx(auVar124,auVar145);
                      auVar145 = vminps_avx(auVar205,auVar126);
                      auVar124 = vmaxps_avx(auVar124,auVar145);
                      auVar148._0_4_ = auVar245._0_4_ * auVar124._0_4_;
                      auVar148._4_4_ = auVar245._4_4_ * auVar124._4_4_;
                      auVar148._8_4_ = auVar245._8_4_ * auVar124._8_4_;
                      auVar148._12_4_ = auVar245._12_4_ * auVar124._12_4_;
                      auVar124 = vmaxps_avx(auVar68,auVar87);
                      auVar145 = vmaxps_avx(auVar180,auVar107);
                      auVar145 = vminps_avx(auVar124,auVar145);
                      auVar124 = vmaxps_avx(auVar205,auVar126);
                      auVar124 = vminps_avx(auVar145,auVar124);
                      auVar69._0_4_ = auVar270._0_4_ * auVar124._0_4_;
                      auVar69._4_4_ = auVar270._4_4_ * auVar124._4_4_;
                      auVar69._8_4_ = auVar270._8_4_ * auVar124._8_4_;
                      auVar69._12_4_ = auVar270._12_4_ * auVar124._12_4_;
                      auVar124 = vmaxps_avx(auVar148,(undefined1  [16])tray.tnear.field_0);
                      auVar103 = ZEXT1664(auVar124);
                      auVar145 = vminps_avx(auVar69,(undefined1  [16])tray.tfar.field_0);
                      auVar124 = vcmpps_avx(auVar124,auVar145,2);
                      auVar124 = auVar60 & auVar124;
                      if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar124 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar124[0xf]) {
                        bVar50 = false;
                      }
                      else {
                        uVar7 = *(ushort *)(lVar36 + lVar16 * 8);
                        uVar8 = *(ushort *)(lVar36 + 2 + lVar16 * 8);
                        uVar30 = *(uint *)(lVar36 + 0x50);
                        uVar9 = *(uint *)(lVar36 + 4 + lVar16 * 8);
                        pGVar12 = (context->scene->geometries).items[uVar30].ptr;
                        lVar13 = *(long *)&pGVar12->field_0x58;
                        lVar14 = *(long *)&pGVar12[1].time_range.upper;
                        lVar34 = (ulong)uVar9 *
                                 pGVar12[1].super_RefCount.refCounter.
                                 super___atomic_base<unsigned_long>._M_i;
                        uVar42 = uVar7 & 0x7fff;
                        uVar43 = uVar8 & 0x7fff;
                        uVar10 = *(uint *)(lVar13 + 4 + lVar34);
                        uVar45 = (ulong)uVar10;
                        uVar48 = (ulong)(uVar10 * uVar43 + *(int *)(lVar13 + lVar34) + uVar42);
                        p_Var15 = pGVar12[1].intersectionFilterN;
                        puVar46 = (undefined8 *)(lVar14 + (uVar48 + 1) * (long)p_Var15);
                        lVar16 = uVar48 + uVar45;
                        lVar41 = uVar48 + uVar45 + 1;
                        puVar2 = (undefined8 *)(lVar14 + lVar16 * (long)p_Var15);
                        uStack_17a0 = puVar2[1];
                        local_1768 = *(undefined1 (*) [16])(lVar14 + lVar41 * (long)p_Var15);
                        auVar103 = ZEXT1664(local_1768);
                        uVar44 = (ulong)(-1 < (short)uVar7);
                        lVar37 = uVar44 + lVar41;
                        local_1778 = *(undefined1 (*) [16])(lVar14 + lVar37 * (long)p_Var15);
                        if ((short)uVar8 < 0) {
                          uVar45 = 0;
                        }
                        local_1738 = *(undefined1 (*) [16])
                                      (lVar14 + (lVar41 + uVar45) * (long)p_Var15);
                        puVar3 = (undefined8 *)(lVar14 + (uVar45 + lVar37) * (long)p_Var15);
                        lower_x.field_0 =
                             *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                              (lVar14 + (long)p_Var15 * uVar48);
                        local_1798 = *puVar46;
                        uStack_1790 = puVar46[1];
                        local_1788 = *(undefined1 (*) [16])
                                      (lVar14 + (uVar48 + uVar44 + 1) * (long)p_Var15);
                        local_1758 = *puVar2;
                        uStack_1750 = uStack_17a0;
                        local_1748 = local_1768;
                        local_1728 = *(undefined1 (*) [16])
                                      (lVar14 + (lVar16 + uVar45) * (long)p_Var15);
                        local_1718 = local_1768;
                        local_1708 = local_1778;
                        local_16f8 = *puVar3;
                        uStack_16f0 = puVar3[1];
                        local_16e8 = local_1738;
                        auVar145 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
                        auVar105 = vshufps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0);
                        puVar46 = &uStack_17a0;
                        uVar44 = 0;
                        auVar124 = auVar60;
                        do {
                          if (uVar44 == 4) break;
                          uVar31 = *(undefined4 *)(puVar46 + -7);
                          auVar197._4_4_ = uVar31;
                          auVar197._0_4_ = uVar31;
                          auVar197._8_4_ = uVar31;
                          auVar197._12_4_ = uVar31;
                          uVar31 = *(undefined4 *)((long)puVar46 + -0x34);
                          auVar88._4_4_ = uVar31;
                          auVar88._0_4_ = uVar31;
                          auVar88._8_4_ = uVar31;
                          auVar88._12_4_ = uVar31;
                          uVar31 = *(undefined4 *)(puVar46 + -6);
                          auVar127._4_4_ = uVar31;
                          auVar127._0_4_ = uVar31;
                          auVar127._8_4_ = uVar31;
                          auVar127._12_4_ = uVar31;
                          uVar31 = *(undefined4 *)(puVar46 + -1);
                          auVar149._4_4_ = uVar31;
                          auVar149._0_4_ = uVar31;
                          auVar149._8_4_ = uVar31;
                          auVar149._12_4_ = uVar31;
                          uVar31 = *(undefined4 *)((long)puVar46 + -4);
                          auVar181._4_4_ = uVar31;
                          auVar181._0_4_ = uVar31;
                          auVar181._8_4_ = uVar31;
                          auVar181._12_4_ = uVar31;
                          uVar31 = *(undefined4 *)puVar46;
                          auVar206._4_4_ = uVar31;
                          auVar206._0_4_ = uVar31;
                          auVar206._8_4_ = uVar31;
                          auVar206._12_4_ = uVar31;
                          local_1838 = auVar145._0_8_;
                          uStack_1830 = auVar145._8_8_;
                          local_1998 = local_1838;
                          uStack_1990 = uStack_1830;
                          local_1848 = auVar105._0_8_;
                          uStack_1840 = auVar105._8_8_;
                          local_19a8 = local_1848;
                          uStack_19a0 = uStack_1840;
                          auVar82 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar95 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar91 = vsubps_avx(auVar88,auVar82);
                          auVar92 = vsubps_avx(auVar127,auVar95);
                          auVar230 = vsubps_avx(auVar181,auVar82);
                          auVar231 = vsubps_avx(auVar206,auVar95);
                          auVar81 = vsubps_avx(auVar230,auVar91);
                          auVar251 = vsubps_avx(auVar231,auVar92);
                          fVar227 = auVar91._0_4_;
                          fVar200 = fVar227 + auVar230._0_4_;
                          fVar229 = auVar91._4_4_;
                          fVar209 = fVar229 + auVar230._4_4_;
                          fVar238 = auVar91._8_4_;
                          fVar211 = fVar238 + auVar230._8_4_;
                          fVar239 = auVar91._12_4_;
                          fVar213 = fVar239 + auVar230._12_4_;
                          fVar264 = auVar92._0_4_;
                          fVar240 = fVar264 + auVar231._0_4_;
                          fVar266 = auVar92._4_4_;
                          fVar246 = fVar266 + auVar231._4_4_;
                          fVar271 = auVar92._8_4_;
                          fVar247 = fVar271 + auVar231._8_4_;
                          fVar272 = auVar92._12_4_;
                          fVar248 = fVar272 + auVar231._12_4_;
                          fVar273 = auVar251._0_4_;
                          auVar216._0_4_ = fVar273 * fVar200;
                          fVar277 = auVar251._4_4_;
                          auVar216._4_4_ = fVar277 * fVar209;
                          fVar278 = auVar251._8_4_;
                          auVar216._8_4_ = fVar278 * fVar211;
                          fVar279 = auVar251._12_4_;
                          auVar216._12_4_ = fVar279 * fVar213;
                          fVar51 = auVar81._0_4_;
                          auVar252._0_4_ = fVar240 * fVar51;
                          fVar104 = auVar81._4_4_;
                          auVar252._4_4_ = fVar246 * fVar104;
                          fVar250 = auVar81._8_4_;
                          auVar252._8_4_ = fVar247 * fVar250;
                          fVar143 = auVar81._12_4_;
                          auVar252._12_4_ = fVar248 * fVar143;
                          auVar251 = vsubps_avx(auVar252,auVar216);
                          auVar81 = *(undefined1 (*) [16])ray;
                          auVar19 = vsubps_avx(auVar197,auVar81);
                          auVar20 = vsubps_avx(auVar149,auVar81);
                          auVar52 = vsubps_avx(auVar20,auVar19);
                          fVar83 = auVar52._0_4_;
                          auVar241._0_4_ = fVar240 * fVar83;
                          fVar122 = auVar52._4_4_;
                          auVar241._4_4_ = fVar246 * fVar122;
                          fVar262 = auVar52._8_4_;
                          auVar241._8_4_ = fVar247 * fVar262;
                          fVar171 = auVar52._12_4_;
                          auVar241._12_4_ = fVar248 * fVar171;
                          fVar240 = auVar19._0_4_;
                          fVar249 = auVar20._0_4_ + fVar240;
                          fVar246 = auVar19._4_4_;
                          fVar261 = auVar20._4_4_ + fVar246;
                          fVar247 = auVar19._8_4_;
                          fVar263 = auVar20._8_4_ + fVar247;
                          fVar248 = auVar19._12_4_;
                          fVar265 = auVar20._12_4_ + fVar248;
                          auVar274._0_4_ = fVar249 * fVar273;
                          auVar274._4_4_ = fVar261 * fVar277;
                          auVar274._8_4_ = fVar263 * fVar278;
                          auVar274._12_4_ = fVar265 * fVar279;
                          auVar52 = vsubps_avx(auVar274,auVar241);
                          auVar242._0_4_ = fVar249 * fVar51;
                          auVar242._4_4_ = fVar261 * fVar104;
                          auVar242._8_4_ = fVar263 * fVar250;
                          auVar242._12_4_ = fVar265 * fVar143;
                          auVar207._0_4_ = fVar83 * fVar200;
                          auVar207._4_4_ = fVar122 * fVar209;
                          auVar207._8_4_ = fVar262 * fVar211;
                          auVar207._12_4_ = fVar171 * fVar213;
                          auVar53 = vsubps_avx(auVar207,auVar242);
                          auVar285 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar141 = *(float *)(ray + 0x6c);
                          auVar27 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar144 = *(float *)(ray + 0x5c);
                          fVar172 = *(float *)(ray + 0x40);
                          fVar174 = *(float *)(ray + 0x44);
                          fVar176 = *(float *)(ray + 0x48);
                          auVar28 = *(undefined1 (*) [12])(ray + 0x40);
                          fVar177 = *(float *)(ray + 0x4c);
                          auVar275._0_4_ =
                               auVar251._0_4_ * fVar172 +
                               auVar52._0_4_ * *(float *)(ray + 0x50) +
                               auVar53._0_4_ * *(float *)(ray + 0x60);
                          auVar275._4_4_ =
                               auVar251._4_4_ * fVar174 +
                               auVar52._4_4_ * *(float *)(ray + 0x54) +
                               auVar53._4_4_ * *(float *)(ray + 100);
                          auVar275._8_4_ =
                               auVar251._8_4_ * fVar176 +
                               auVar52._8_4_ * *(float *)(ray + 0x58) +
                               auVar53._8_4_ * *(float *)(ray + 0x68);
                          auVar275._12_4_ =
                               auVar251._12_4_ * fVar177 +
                               auVar52._12_4_ * fVar144 + auVar53._12_4_ * fVar141;
                          uVar31 = *(undefined4 *)((long)puVar46 + -0x24);
                          auVar150._4_4_ = uVar31;
                          auVar150._0_4_ = uVar31;
                          auVar150._8_4_ = uVar31;
                          auVar150._12_4_ = uVar31;
                          auVar82 = vsubps_avx(auVar150,auVar82);
                          uVar31 = *(undefined4 *)(puVar46 + -4);
                          auVar108._4_4_ = uVar31;
                          auVar108._0_4_ = uVar31;
                          auVar108._8_4_ = uVar31;
                          auVar108._12_4_ = uVar31;
                          auVar95 = vsubps_avx(auVar108,auVar95);
                          auVar91 = vsubps_avx(auVar91,auVar82);
                          auVar92 = vsubps_avx(auVar92,auVar95);
                          fVar209 = fVar227 + auVar82._0_4_;
                          fVar213 = fVar229 + auVar82._4_4_;
                          fVar261 = fVar238 + auVar82._8_4_;
                          fVar265 = fVar239 + auVar82._12_4_;
                          fVar201 = fVar264 + auVar95._0_4_;
                          fVar210 = fVar266 + auVar95._4_4_;
                          fVar212 = fVar271 + auVar95._8_4_;
                          fVar214 = fVar272 + auVar95._12_4_;
                          fVar200 = auVar92._0_4_;
                          auVar234._0_4_ = fVar209 * fVar200;
                          fVar211 = auVar92._4_4_;
                          auVar234._4_4_ = fVar213 * fVar211;
                          fVar249 = auVar92._8_4_;
                          auVar234._8_4_ = fVar261 * fVar249;
                          fVar263 = auVar92._12_4_;
                          auVar234._12_4_ = fVar265 * fVar263;
                          fVar280 = auVar91._0_4_;
                          auVar243._0_4_ = fVar280 * fVar201;
                          fVar281 = auVar91._4_4_;
                          auVar243._4_4_ = fVar281 * fVar210;
                          fVar282 = auVar91._8_4_;
                          auVar243._8_4_ = fVar282 * fVar212;
                          fVar284 = auVar91._12_4_;
                          auVar243._12_4_ = fVar284 * fVar214;
                          auVar91 = vsubps_avx(auVar243,auVar234);
                          uVar31 = *(undefined4 *)(puVar46 + -5);
                          auVar244._4_4_ = uVar31;
                          auVar244._0_4_ = uVar31;
                          auVar244._8_4_ = uVar31;
                          auVar244._12_4_ = uVar31;
                          auVar81 = vsubps_avx(auVar244,auVar81);
                          auVar92 = vsubps_avx(auVar19,auVar81);
                          fVar286 = auVar92._0_4_;
                          auVar208._0_4_ = fVar286 * fVar201;
                          fVar287 = auVar92._4_4_;
                          auVar208._4_4_ = fVar287 * fVar210;
                          fVar288 = auVar92._8_4_;
                          auVar208._8_4_ = fVar288 * fVar212;
                          fVar289 = auVar92._12_4_;
                          auVar208._12_4_ = fVar289 * fVar214;
                          fVar201 = auVar81._0_4_ + fVar240;
                          fVar210 = auVar81._4_4_ + fVar246;
                          fVar212 = auVar81._8_4_ + fVar247;
                          fVar214 = auVar81._12_4_ + fVar248;
                          auVar253._0_4_ = fVar201 * fVar200;
                          auVar253._4_4_ = fVar210 * fVar211;
                          auVar253._8_4_ = fVar212 * fVar249;
                          auVar253._12_4_ = fVar214 * fVar263;
                          auVar92 = vsubps_avx(auVar253,auVar208);
                          auVar254._0_4_ = fVar201 * fVar280;
                          auVar254._4_4_ = fVar210 * fVar281;
                          auVar254._8_4_ = fVar212 * fVar282;
                          auVar254._12_4_ = fVar214 * fVar284;
                          auVar70._0_4_ = fVar286 * fVar209;
                          auVar70._4_4_ = fVar287 * fVar213;
                          auVar70._8_4_ = fVar288 * fVar261;
                          auVar70._12_4_ = fVar289 * fVar265;
                          auVar251 = vsubps_avx(auVar70,auVar254);
                          local_1c38 = auVar285._0_4_;
                          fStack_1c34 = auVar285._4_4_;
                          fStack_1c30 = auVar285._8_4_;
                          local_1c48 = auVar27._0_4_;
                          fStack_1c44 = auVar27._4_4_;
                          fStack_1c40 = auVar27._8_4_;
                          local_1b38._0_4_ =
                               auVar91._0_4_ * fVar172 +
                               local_1c38 * auVar251._0_4_ + local_1c48 * auVar92._0_4_;
                          local_1b38._4_4_ =
                               auVar91._4_4_ * fVar174 +
                               fStack_1c34 * auVar251._4_4_ + fStack_1c44 * auVar92._4_4_;
                          fStack_1b30 = auVar91._8_4_ * fVar176 +
                                        fStack_1c30 * auVar251._8_4_ + fStack_1c40 * auVar92._8_4_;
                          fStack_1b2c = auVar91._12_4_ * fVar177 +
                                        fVar141 * auVar251._12_4_ + fVar144 * auVar92._12_4_;
                          auVar91 = vsubps_avx(auVar81,auVar20);
                          fVar215 = auVar81._0_4_ + auVar20._0_4_;
                          fVar225 = auVar81._4_4_ + auVar20._4_4_;
                          fVar226 = auVar81._8_4_ + auVar20._8_4_;
                          fVar228 = auVar81._12_4_ + auVar20._12_4_;
                          auVar81 = vsubps_avx(auVar82,auVar230);
                          fVar142 = auVar82._0_4_ + auVar230._0_4_;
                          fVar170 = auVar82._4_4_ + auVar230._4_4_;
                          fVar173 = auVar82._8_4_ + auVar230._8_4_;
                          fVar175 = auVar82._12_4_ + auVar230._12_4_;
                          auVar82 = vsubps_avx(auVar95,auVar231);
                          auVar103 = ZEXT1664(auVar82);
                          fVar123 = auVar95._0_4_ + auVar231._0_4_;
                          fVar138 = auVar95._4_4_ + auVar231._4_4_;
                          fVar139 = auVar95._8_4_ + auVar231._8_4_;
                          fVar140 = auVar95._12_4_ + auVar231._12_4_;
                          fVar209 = auVar82._0_4_;
                          auVar182._0_4_ = fVar142 * fVar209;
                          fVar213 = auVar82._4_4_;
                          auVar182._4_4_ = fVar170 * fVar213;
                          fVar261 = auVar82._8_4_;
                          auVar182._8_4_ = fVar173 * fVar261;
                          fVar265 = auVar82._12_4_;
                          auVar182._12_4_ = fVar175 * fVar265;
                          fVar201 = auVar81._0_4_;
                          auVar235._0_4_ = fVar201 * fVar123;
                          fVar210 = auVar81._4_4_;
                          auVar235._4_4_ = fVar210 * fVar138;
                          fVar212 = auVar81._8_4_;
                          auVar235._8_4_ = fVar212 * fVar139;
                          fVar214 = auVar81._12_4_;
                          auVar235._12_4_ = fVar214 * fVar140;
                          auVar82 = vsubps_avx(auVar235,auVar182);
                          fVar202 = auVar91._0_4_;
                          auVar128._0_4_ = fVar202 * fVar123;
                          fVar123 = auVar91._4_4_;
                          auVar128._4_4_ = fVar123 * fVar138;
                          fVar138 = auVar91._8_4_;
                          auVar128._8_4_ = fVar138 * fVar139;
                          fVar139 = auVar91._12_4_;
                          auVar128._12_4_ = fVar139 * fVar140;
                          auVar236._0_4_ = fVar215 * fVar209;
                          auVar236._4_4_ = fVar225 * fVar213;
                          auVar236._8_4_ = fVar226 * fVar261;
                          auVar236._12_4_ = fVar228 * fVar265;
                          auVar95 = vsubps_avx(auVar236,auVar128);
                          auVar217._0_4_ = fVar215 * fVar201;
                          auVar217._4_4_ = fVar225 * fVar210;
                          auVar217._8_4_ = fVar226 * fVar212;
                          auVar217._12_4_ = fVar228 * fVar214;
                          auVar151._0_4_ = fVar202 * fVar142;
                          auVar151._4_4_ = fVar123 * fVar170;
                          auVar151._8_4_ = fVar138 * fVar173;
                          auVar151._12_4_ = fVar139 * fVar175;
                          auVar81 = vsubps_avx(auVar151,auVar217);
                          auVar255._8_4_ = 0x7fffffff;
                          auVar255._0_8_ = 0x7fffffff7fffffff;
                          auVar255._12_4_ = 0x7fffffff;
                          auVar129._0_4_ =
                               fVar172 * auVar82._0_4_ +
                               local_1c38 * auVar81._0_4_ + local_1c48 * auVar95._0_4_;
                          auVar129._4_4_ =
                               fVar174 * auVar82._4_4_ +
                               fStack_1c34 * auVar81._4_4_ + fStack_1c44 * auVar95._4_4_;
                          auVar129._8_4_ =
                               fVar176 * auVar82._8_4_ +
                               fStack_1c30 * auVar81._8_4_ + fStack_1c40 * auVar95._8_4_;
                          auVar129._12_4_ =
                               fVar177 * auVar82._12_4_ +
                               fVar141 * auVar81._12_4_ + fVar144 * auVar95._12_4_;
                          auVar198._0_4_ = auVar129._0_4_ + auVar275._0_4_ + (float)local_1b38._0_4_
                          ;
                          auVar198._4_4_ = auVar129._4_4_ + auVar275._4_4_ + (float)local_1b38._4_4_
                          ;
                          auVar198._8_4_ = auVar129._8_4_ + auVar275._8_4_ + fStack_1b30;
                          auVar198._12_4_ = auVar129._12_4_ + auVar275._12_4_ + fStack_1b2c;
                          auVar82 = vminps_avx(auVar275,_local_1b38);
                          auVar95 = vminps_avx(auVar82,auVar129);
                          auVar82 = vandps_avx(auVar255,auVar198);
                          auVar183._0_4_ = auVar82._0_4_ * 1.1920929e-07;
                          auVar183._4_4_ = auVar82._4_4_ * 1.1920929e-07;
                          auVar183._8_4_ = auVar82._8_4_ * 1.1920929e-07;
                          auVar183._12_4_ = auVar82._12_4_ * 1.1920929e-07;
                          uVar45 = CONCAT44(auVar183._4_4_,auVar183._0_4_);
                          auVar218._0_8_ = uVar45 ^ 0x8000000080000000;
                          auVar218._8_4_ = -auVar183._8_4_;
                          auVar218._12_4_ = -auVar183._12_4_;
                          auVar95 = vcmpps_avx(auVar95,auVar218,5);
                          auVar81 = vmaxps_avx(auVar275,_local_1b38);
                          auVar81 = vmaxps_avx(auVar81,auVar129);
                          auVar81 = vcmpps_avx(auVar81,auVar183,2);
                          auVar95 = vorps_avx(auVar95,auVar81);
                          auVar91 = auVar124 & auVar95;
                          uVar31 = *(undefined4 *)(puVar46 + -3);
                          uVar4 = *(undefined4 *)((long)puVar46 + -0x14);
                          uVar5 = *(undefined4 *)(puVar46 + -2);
                          auVar152._4_4_ = uVar5;
                          auVar152._0_4_ = uVar5;
                          auVar152._8_4_ = uVar5;
                          auVar152._12_4_ = uVar5;
                          auVar81 = auVar124;
                          if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar91 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar91[0xf]) {
                            auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            auVar153._0_4_ = fVar280 * fVar273;
                            auVar153._4_4_ = fVar281 * fVar277;
                            auVar153._8_4_ = fVar282 * fVar278;
                            auVar153._12_4_ = fVar284 * fVar279;
                            auVar184._0_4_ = fVar51 * fVar200;
                            auVar184._4_4_ = fVar104 * fVar211;
                            auVar184._8_4_ = fVar250 * fVar249;
                            auVar184._12_4_ = fVar143 * fVar263;
                            auVar230 = vsubps_avx(auVar184,auVar153);
                            auVar219._0_4_ = fVar201 * fVar200;
                            auVar219._4_4_ = fVar210 * fVar211;
                            auVar219._8_4_ = fVar212 * fVar249;
                            auVar219._12_4_ = fVar214 * fVar263;
                            auVar237._0_4_ = fVar280 * fVar209;
                            auVar237._4_4_ = fVar281 * fVar213;
                            auVar237._8_4_ = fVar282 * fVar261;
                            auVar237._12_4_ = fVar284 * fVar265;
                            auVar231 = vsubps_avx(auVar237,auVar219);
                            auVar91 = vandps_avx(auVar255,auVar153);
                            auVar92 = vandps_avx(auVar219,auVar255);
                            auVar91 = vcmpps_avx(auVar91,auVar92,1);
                            aVar17 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                     vblendvps_avx(auVar231,auVar230,auVar91);
                            auVar89._0_4_ = fVar286 * fVar209;
                            auVar89._4_4_ = fVar287 * fVar213;
                            auVar89._8_4_ = fVar288 * fVar261;
                            auVar89._12_4_ = fVar289 * fVar265;
                            auVar154._0_4_ = fVar286 * fVar273;
                            auVar154._4_4_ = fVar287 * fVar277;
                            auVar154._8_4_ = fVar288 * fVar278;
                            auVar154._12_4_ = fVar289 * fVar279;
                            auVar185._0_4_ = fVar83 * fVar200;
                            auVar185._4_4_ = fVar122 * fVar211;
                            auVar185._8_4_ = fVar262 * fVar249;
                            auVar185._12_4_ = fVar171 * fVar263;
                            auVar230 = vsubps_avx(auVar154,auVar185);
                            auVar109._0_4_ = fVar202 * fVar200;
                            auVar109._4_4_ = fVar123 * fVar211;
                            auVar109._8_4_ = fVar138 * fVar249;
                            auVar109._12_4_ = fVar139 * fVar263;
                            auVar231 = vsubps_avx(auVar109,auVar89);
                            auVar91 = vandps_avx(auVar255,auVar185);
                            auVar92 = vandps_avx(auVar255,auVar89);
                            auVar91 = vcmpps_avx(auVar91,auVar92,1);
                            auVar230 = vblendvps_avx(auVar231,auVar230,auVar91);
                            auVar90._0_4_ = fVar280 * fVar202;
                            auVar90._4_4_ = fVar281 * fVar123;
                            auVar90._8_4_ = fVar282 * fVar138;
                            auVar90._12_4_ = fVar284 * fVar139;
                            auVar110._0_4_ = fVar83 * fVar280;
                            auVar110._4_4_ = fVar122 * fVar281;
                            auVar110._8_4_ = fVar262 * fVar282;
                            auVar110._12_4_ = fVar171 * fVar284;
                            auVar155._0_4_ = fVar286 * fVar51;
                            auVar155._4_4_ = fVar287 * fVar104;
                            auVar155._8_4_ = fVar288 * fVar250;
                            auVar155._12_4_ = fVar289 * fVar143;
                            auVar71._0_4_ = fVar286 * fVar201;
                            auVar71._4_4_ = fVar287 * fVar210;
                            auVar71._8_4_ = fVar288 * fVar212;
                            auVar71._12_4_ = fVar289 * fVar214;
                            auVar231 = vsubps_avx(auVar110,auVar155);
                            auVar251 = vsubps_avx(auVar71,auVar90);
                            auVar91 = vandps_avx(auVar255,auVar155);
                            auVar92 = vandps_avx(auVar255,auVar90);
                            auVar91 = vcmpps_avx(auVar91,auVar92,1);
                            auVar91 = vblendvps_avx(auVar251,auVar231,auVar91);
                            local_1c28 = auVar28._0_4_;
                            fStack_1c24 = auVar28._4_4_;
                            fStack_1c20 = auVar28._8_4_;
                            fVar51 = aVar17.v[0] * local_1c28 +
                                     auVar91._0_4_ * local_1c38 + auVar230._0_4_ * local_1c48;
                            fVar83 = aVar17.v[1] * fStack_1c24 +
                                     auVar91._4_4_ * fStack_1c34 + auVar230._4_4_ * fStack_1c44;
                            fVar200 = aVar17.v[2] * fStack_1c20 +
                                      auVar91._8_4_ * fStack_1c30 + auVar230._8_4_ * fStack_1c40;
                            fVar209 = aVar17.v[3] * fVar177 +
                                      auVar91._12_4_ * fVar141 + auVar230._12_4_ * fVar144;
                            auVar72._0_4_ = fVar51 + fVar51;
                            auVar72._4_4_ = fVar83 + fVar83;
                            auVar72._8_4_ = fVar200 + fVar200;
                            auVar72._12_4_ = fVar209 + fVar209;
                            fVar51 = aVar17.v[0] * fVar240 +
                                     auVar91._0_4_ * fVar264 + auVar230._0_4_ * fVar227;
                            fVar83 = aVar17.v[1] * fVar246 +
                                     auVar91._4_4_ * fVar266 + auVar230._4_4_ * fVar229;
                            fVar200 = aVar17.v[2] * fVar247 +
                                      auVar91._8_4_ * fVar271 + auVar230._8_4_ * fVar238;
                            fVar209 = aVar17.v[3] * fVar248 +
                                      auVar91._12_4_ * fVar272 + auVar230._12_4_ * fVar239;
                            auVar91 = vrcpps_avx(auVar72);
                            fVar240 = auVar91._0_4_;
                            auVar156._0_4_ = auVar72._0_4_ * fVar240;
                            fVar246 = auVar91._4_4_;
                            auVar156._4_4_ = auVar72._4_4_ * fVar246;
                            fVar247 = auVar91._8_4_;
                            auVar156._8_4_ = auVar72._8_4_ * fVar247;
                            fVar248 = auVar91._12_4_;
                            auVar156._12_4_ = auVar72._12_4_ * fVar248;
                            auVar186._8_4_ = 0x3f800000;
                            auVar186._0_8_ = 0x3f8000003f800000;
                            auVar186._12_4_ = 0x3f800000;
                            auVar91 = vsubps_avx(auVar186,auVar156);
                            auVar157._0_4_ = (fVar51 + fVar51) * (fVar240 + fVar240 * auVar91._0_4_)
                            ;
                            auVar157._4_4_ = (fVar83 + fVar83) * (fVar246 + fVar246 * auVar91._4_4_)
                            ;
                            auVar157._8_4_ =
                                 (fVar200 + fVar200) * (fVar247 + fVar247 * auVar91._8_4_);
                            auVar157._12_4_ =
                                 (fVar209 + fVar209) * (fVar248 + fVar248 * auVar91._12_4_);
                            auVar91 = vcmpps_avx(auVar157,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar92 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar157,2);
                            auVar91 = vandps_avx(auVar92,auVar91);
                            auVar92 = vcmpps_avx(auVar72,ZEXT816(0),4);
                            auVar91 = vandps_avx(auVar92,auVar91);
                            auVar95 = vandps_avx(auVar124,auVar95);
                            auVar91 = vpslld_avx(auVar91,0x1f);
                            auVar92 = vpsrad_avx(auVar91,0x1f);
                            auVar103 = ZEXT1664(auVar92);
                            auVar91 = auVar95 & auVar92;
                            if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar91 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar91[0xf]) {
                              auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              uVar9 = *(uint *)((long)&local_1998 + uVar44 * 4);
                              pGVar12 = (context->scene->geometries).items[uVar9].ptr;
                              uVar30 = pGVar12->mask;
                              auVar111._4_4_ = uVar30;
                              auVar111._0_4_ = uVar30;
                              auVar111._8_4_ = uVar30;
                              auVar111._12_4_ = uVar30;
                              auVar91 = vandps_avx(auVar111,*(undefined1 (*) [16])(ray + 0x90));
                              auVar95 = vandps_avx(auVar92,auVar95);
                              auVar91 = vpcmpeqd_avx(auVar91,ZEXT816(0));
                              auVar92 = auVar95 & ~auVar91;
                              auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar92 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || auVar92[0xf] < '\0') {
                                uVar30 = *(uint *)((long)&local_19a8 + uVar44 * 4);
                                aVar101 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                          vandnps_avx(auVar91,auVar95);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar77._0_4_ = (float)(int)(*(ushort *)(lVar13 + 8 + lVar34) - 1)
                                  ;
                                  auVar285 = aVar17._4_12_;
                                  auVar77._4_12_ = auVar285;
                                  auVar81 = vrcpss_avx(auVar77,auVar77);
                                  auVar115._0_4_ =
                                       (float)(int)(*(ushort *)(lVar13 + 10 + lVar34) - 1);
                                  auVar115._4_12_ = auVar285;
                                  auVar97._0_4_ = (float)(((uint)uVar44 & 1) + uVar42);
                                  auVar97._4_12_ = auVar285;
                                  auVar91 = vshufps_avx(auVar97,auVar97,0);
                                  auVar81 = ZEXT416((uint)(auVar81._0_4_ *
                                                          (2.0 - auVar81._0_4_ * auVar77._0_4_)));
                                  auVar81 = vshufps_avx(auVar81,auVar81,0);
                                  auVar78._0_4_ =
                                       (auVar275._0_4_ + auVar198._0_4_ * auVar91._0_4_) *
                                       auVar81._0_4_;
                                  auVar78._4_4_ =
                                       (auVar275._4_4_ + auVar198._4_4_ * auVar91._4_4_) *
                                       auVar81._4_4_;
                                  auVar78._8_4_ =
                                       (auVar275._8_4_ + auVar198._8_4_ * auVar91._8_4_) *
                                       auVar81._8_4_;
                                  auVar78._12_4_ =
                                       (auVar275._12_4_ + auVar198._12_4_ * auVar91._12_4_) *
                                       auVar81._12_4_;
                                  auVar91 = vrcpss_avx(auVar115,auVar115);
                                  auVar81 = vblendvps_avx(auVar275,auVar78,auVar95);
                                  auVar116._0_4_ =
                                       (float)(int)(((uint)(uVar44 >> 1) & 0x7fffffff) + uVar43);
                                  auVar116._4_12_ = auVar285;
                                  auVar92 = vshufps_avx(auVar116,auVar116,0);
                                  auVar91 = ZEXT416((uint)(auVar91._0_4_ *
                                                          (2.0 - auVar91._0_4_ * auVar115._0_4_)));
                                  auVar91 = vshufps_avx(auVar91,auVar91,0);
                                  auVar98._0_4_ =
                                       ((float)local_1b38._0_4_ + auVar198._0_4_ * auVar92._0_4_) *
                                       auVar91._0_4_;
                                  auVar98._4_4_ =
                                       ((float)local_1b38._4_4_ + auVar198._4_4_ * auVar92._4_4_) *
                                       auVar91._4_4_;
                                  auVar98._8_4_ =
                                       (fStack_1b30 + auVar198._8_4_ * auVar92._8_4_) *
                                       auVar91._8_4_;
                                  auVar98._12_4_ =
                                       (fStack_1b2c + auVar198._12_4_ * auVar92._12_4_) *
                                       auVar91._12_4_;
                                  auVar91 = vblendvps_avx(_local_1b38,auVar98,auVar95);
                                  auVar92 = vrcpps_avx(auVar198);
                                  fVar240 = auVar92._0_4_;
                                  auVar136._0_4_ = auVar198._0_4_ * fVar240;
                                  fVar246 = auVar92._4_4_;
                                  auVar136._4_4_ = auVar198._4_4_ * fVar246;
                                  fVar247 = auVar92._8_4_;
                                  auVar136._8_4_ = auVar198._8_4_ * fVar247;
                                  fVar248 = auVar92._12_4_;
                                  auVar136._12_4_ = auVar198._12_4_ * fVar248;
                                  auVar193._8_4_ = 0x3f800000;
                                  auVar193._0_8_ = 0x3f8000003f800000;
                                  auVar193._12_4_ = 0x3f800000;
                                  auVar92 = vsubps_avx(auVar193,auVar136);
                                  auVar117._0_4_ = fVar240 + fVar240 * auVar92._0_4_;
                                  auVar117._4_4_ = fVar246 + fVar246 * auVar92._4_4_;
                                  auVar117._8_4_ = fVar247 + fVar247 * auVar92._8_4_;
                                  auVar117._12_4_ = fVar248 + fVar248 * auVar92._12_4_;
                                  auVar137._8_4_ = 0x219392ef;
                                  auVar137._0_8_ = 0x219392ef219392ef;
                                  auVar137._12_4_ = 0x219392ef;
                                  auVar82 = vcmpps_avx(auVar82,auVar137,5);
                                  auVar82 = vandps_avx(auVar82,auVar117);
                                  auVar79._0_4_ = auVar81._0_4_ * auVar82._0_4_;
                                  auVar79._4_4_ = auVar81._4_4_ * auVar82._4_4_;
                                  auVar79._8_4_ = auVar81._8_4_ * auVar82._8_4_;
                                  auVar79._12_4_ = auVar81._12_4_ * auVar82._12_4_;
                                  vminps_avx(auVar79,auVar193);
                                  auVar99._0_4_ = auVar91._0_4_ * auVar82._0_4_;
                                  auVar99._4_4_ = auVar91._4_4_ * auVar82._4_4_;
                                  auVar99._8_4_ = auVar91._8_4_ * auVar82._8_4_;
                                  auVar99._12_4_ = auVar91._12_4_ * auVar82._12_4_;
                                  vminps_avx(auVar99,auVar193);
                                  lower_y.field_0._0_8_ = &upper_y;
                                  lower_y.field_0._8_8_ = &t;
                                  upper_x.field_0 = aVar17;
                                  std::
                                  _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                  ::
                                  _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                            ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                              *)&lower_y,
                                             (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                              *)&upper_x);
                                  auVar82 = vpshufd_avx(ZEXT416(uVar9),0);
                                  auVar81 = ZEXT416(uVar30);
                                  vshufps_avx(auVar81,auVar81,0);
                                  upper_x.field_0.v[1] = (float)upper_y.field_0.i[1];
                                  upper_x.field_0.v[0] = (float)upper_y.field_0.i[0];
                                  upper_x.field_0.v[3] = (float)upper_y.field_0.i[3];
                                  upper_x.field_0.v[2] = (float)upper_y.field_0.i[2];
                                  vcmpps_avx(ZEXT1632(auVar82),ZEXT1632(auVar82),0xf);
                                  auVar82 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar81 = vblendvps_avx(auVar82,(undefined1  [16])t.field_0,
                                                          (undefined1  [16])aVar101);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar81;
                                  lower_z.field_0 = aVar101;
                                  lower_y.field_0._0_8_ = &lower_z;
                                  lower_y.field_0._8_8_ = pGVar12->userPtr;
                                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar12->occlusionFilterN)
                                              ((RTCFilterFunctionNArguments *)&lower_y);
                                  }
                                  if (lower_z.field_0 ==
                                      (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                    auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                                    auVar81 = auVar81 ^ _DAT_01f46b70;
                                    auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                  CONCAT48(0x7f800000,
                                                                           0x7f8000007f800000)));
                                    auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                  CONCAT48(0x3f7ffffa,
                                                                           0x3f7ffffa3f7ffffa)));
                                    auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                  CONCAT48(0x3f800003,
                                                                           0x3f8000033f800003)));
                                  }
                                  else {
                                    p_Var15 = context->args->filter;
                                    if (p_Var15 == (RTCFilterFunctionN)0x0) {
                                      auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                      auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                    CONCAT48(0x3f7ffffa,
                                                                             0x3f7ffffa3f7ffffa)));
                                      auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                    CONCAT48(0x3f800003,
                                                                             0x3f8000033f800003)));
                                    }
                                    else {
                                      auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                      auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                    CONCAT48(0x3f7ffffa,
                                                                             0x3f7ffffa3f7ffffa)));
                                      auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                    CONCAT48(0x3f800003,
                                                                             0x3f8000033f800003)));
                                      if (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                         (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                        (*p_Var15)((RTCFilterFunctionNArguments *)&lower_y);
                                        auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                      CONCAT48(0x3f800003,
                                                                               0x3f8000033f800003)))
                                        ;
                                        auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                      CONCAT48(0x3f7ffffa,
                                                                               0x3f7ffffa3f7ffffa)))
                                        ;
                                        auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                      }
                                    }
                                    auVar91 = vpcmpeqd_avx((undefined1  [16])lower_z.field_0,
                                                           _DAT_01f45a50);
                                    auVar81 = auVar91 ^ _DAT_01f46b70;
                                    auVar119._8_4_ = 0xff800000;
                                    auVar119._0_8_ = 0xff800000ff800000;
                                    auVar119._12_4_ = 0xff800000;
                                    auVar91 = vblendvps_avx(auVar119,*(undefined1 (*) [16])
                                                                      (ray + 0x80),auVar91);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar91;
                                  }
                                  auVar81 = vpslld_avx(auVar81,0x1f);
                                  aVar101 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                            vpsrad_avx(auVar81,0x1f);
                                  auVar82 = vblendvps_avx(auVar82,*(undefined1 (*) [16])pRVar1,
                                                          auVar81);
                                  *(undefined1 (*) [16])pRVar1 = auVar82;
                                }
                                auVar103 = ZEXT1664((undefined1  [16])aVar101);
                                auVar81 = vpandn_avx((undefined1  [16])aVar101,auVar124);
                              }
                              auVar130._0_4_ = auVar95._0_4_ ^ auVar124._0_4_;
                              auVar130._4_4_ = auVar95._4_4_ ^ auVar124._4_4_;
                              auVar130._8_4_ = auVar95._8_4_ ^ auVar124._8_4_;
                              auVar130._12_4_ = auVar95._12_4_ ^ auVar124._12_4_;
                              auVar124 = auVar130;
                            }
                          }
                          auVar82 = auVar124 >> 0x1f;
                          auVar95 = auVar124 >> 0x3f;
                          auVar91 = auVar124 >> 0x5f;
                          cVar21 = auVar124[0xf];
                          auVar124 = auVar81;
                          if ((((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar91 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              cVar21 < '\0') {
                            auVar82 = *(undefined1 (*) [16])ray;
                            auVar95 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar91 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar26._4_4_ = uVar31;
                            auVar26._0_4_ = uVar31;
                            auVar26._8_4_ = uVar31;
                            auVar26._12_4_ = uVar31;
                            auVar92 = vsubps_avx(auVar26,auVar82);
                            auVar25._4_4_ = uVar4;
                            auVar25._0_4_ = uVar4;
                            auVar25._8_4_ = uVar4;
                            auVar25._12_4_ = uVar4;
                            auVar230 = vsubps_avx(auVar25,auVar95);
                            auVar231 = vsubps_avx(auVar152,auVar91);
                            auVar251 = vsubps_avx(auVar149,auVar82);
                            auVar19 = vsubps_avx(auVar181,auVar95);
                            auVar20 = vsubps_avx(auVar206,auVar91);
                            auVar52 = vsubps_avx(auVar244,auVar82);
                            auVar95 = vsubps_avx(auVar150,auVar95);
                            auVar91 = vsubps_avx(auVar108,auVar91);
                            auVar82 = vsubps_avx(auVar52,auVar92);
                            auVar53 = vsubps_avx(auVar95,auVar230);
                            auVar54 = vsubps_avx(auVar91,auVar231);
                            fVar240 = auVar230._0_4_;
                            fVar51 = auVar95._0_4_ + fVar240;
                            fVar246 = auVar230._4_4_;
                            fVar83 = auVar95._4_4_ + fVar246;
                            fVar247 = auVar230._8_4_;
                            fVar200 = auVar95._8_4_ + fVar247;
                            fVar248 = auVar230._12_4_;
                            fVar209 = auVar95._12_4_ + fVar248;
                            fVar288 = auVar231._0_4_;
                            fVar104 = fVar288 + auVar91._0_4_;
                            fVar291 = auVar231._4_4_;
                            fVar122 = fVar291 + auVar91._4_4_;
                            fVar293 = auVar231._8_4_;
                            fVar211 = fVar293 + auVar91._8_4_;
                            fVar295 = auVar231._12_4_;
                            fVar213 = fVar295 + auVar91._12_4_;
                            fVar282 = auVar54._0_4_;
                            auVar256._0_4_ = fVar282 * fVar51;
                            fVar284 = auVar54._4_4_;
                            auVar256._4_4_ = fVar284 * fVar83;
                            fVar286 = auVar54._8_4_;
                            auVar256._8_4_ = fVar286 * fVar200;
                            fVar287 = auVar54._12_4_;
                            auVar256._12_4_ = fVar287 * fVar209;
                            fVar177 = auVar53._0_4_;
                            auVar267._0_4_ = fVar177 * fVar104;
                            fVar201 = auVar53._4_4_;
                            auVar267._4_4_ = fVar201 * fVar122;
                            fVar210 = auVar53._8_4_;
                            auVar267._8_4_ = fVar210 * fVar211;
                            fVar212 = auVar53._12_4_;
                            auVar267._12_4_ = fVar212 * fVar213;
                            auVar53 = vsubps_avx(auVar267,auVar256);
                            fVar271 = auVar92._0_4_;
                            fVar250 = fVar271 + auVar52._0_4_;
                            fVar273 = auVar92._4_4_;
                            fVar262 = fVar273 + auVar52._4_4_;
                            fVar278 = auVar92._8_4_;
                            fVar249 = fVar278 + auVar52._8_4_;
                            fVar280 = auVar92._12_4_;
                            fVar261 = fVar280 + auVar52._12_4_;
                            fVar226 = auVar82._0_4_;
                            auVar112._0_4_ = fVar226 * fVar104;
                            fVar228 = auVar82._4_4_;
                            auVar112._4_4_ = fVar228 * fVar122;
                            fVar227 = auVar82._8_4_;
                            auVar112._8_4_ = fVar227 * fVar211;
                            fVar229 = auVar82._12_4_;
                            auVar112._12_4_ = fVar229 * fVar213;
                            auVar268._0_4_ = fVar250 * fVar282;
                            auVar268._4_4_ = fVar262 * fVar284;
                            auVar268._8_4_ = fVar249 * fVar286;
                            auVar268._12_4_ = fVar261 * fVar287;
                            auVar54 = vsubps_avx(auVar268,auVar112);
                            auVar257._0_4_ = fVar250 * fVar177;
                            auVar257._4_4_ = fVar262 * fVar201;
                            auVar257._8_4_ = fVar249 * fVar210;
                            auVar257._12_4_ = fVar261 * fVar212;
                            auVar73._0_4_ = fVar226 * fVar51;
                            auVar73._4_4_ = fVar228 * fVar83;
                            auVar73._8_4_ = fVar227 * fVar200;
                            auVar73._12_4_ = fVar229 * fVar209;
                            auVar55 = vsubps_avx(auVar73,auVar257);
                            fVar51 = *(float *)(ray + 0x60);
                            fVar83 = *(float *)(ray + 100);
                            fVar200 = *(float *)(ray + 0x68);
                            auVar285 = *(undefined1 (*) [12])(ray + 0x60);
                            fVar209 = *(float *)(ray + 0x6c);
                            fVar104 = *(float *)(ray + 0x50);
                            fVar122 = *(float *)(ray + 0x54);
                            fVar211 = *(float *)(ray + 0x58);
                            auVar27 = *(undefined1 (*) [12])(ray + 0x50);
                            fVar213 = *(float *)(ray + 0x5c);
                            auVar82 = *(undefined1 (*) [16])(ray + 0x40);
                            fVar175 = auVar82._0_4_;
                            fVar202 = auVar82._4_4_;
                            fVar215 = auVar82._8_4_;
                            fVar225 = auVar82._12_4_;
                            auVar269._0_4_ =
                                 fVar175 * auVar53._0_4_ +
                                 fVar51 * auVar55._0_4_ + fVar104 * auVar54._0_4_;
                            auVar269._4_4_ =
                                 fVar202 * auVar53._4_4_ +
                                 fVar83 * auVar55._4_4_ + fVar122 * auVar54._4_4_;
                            auVar269._8_4_ =
                                 fVar215 * auVar53._8_4_ +
                                 fVar200 * auVar55._8_4_ + fVar211 * auVar54._8_4_;
                            auVar269._12_4_ =
                                 fVar225 * auVar53._12_4_ +
                                 fVar209 * auVar55._12_4_ + fVar213 * auVar54._12_4_;
                            auVar82 = vsubps_avx(auVar230,auVar19);
                            auVar230 = vsubps_avx(auVar231,auVar20);
                            fVar250 = fVar240 + auVar19._0_4_;
                            fVar262 = fVar246 + auVar19._4_4_;
                            fVar249 = fVar247 + auVar19._8_4_;
                            fVar261 = fVar248 + auVar19._12_4_;
                            fVar143 = fVar288 + auVar20._0_4_;
                            fVar171 = fVar291 + auVar20._4_4_;
                            fVar263 = fVar293 + auVar20._8_4_;
                            fVar265 = fVar295 + auVar20._12_4_;
                            fVar238 = auVar230._0_4_;
                            auVar290._0_4_ = fVar238 * fVar250;
                            fVar239 = auVar230._4_4_;
                            auVar290._4_4_ = fVar239 * fVar262;
                            fVar264 = auVar230._8_4_;
                            auVar290._8_4_ = fVar264 * fVar249;
                            fVar266 = auVar230._12_4_;
                            auVar290._12_4_ = fVar266 * fVar261;
                            fVar214 = auVar82._0_4_;
                            auVar187._0_4_ = fVar214 * fVar143;
                            fVar138 = auVar82._4_4_;
                            auVar187._4_4_ = fVar138 * fVar171;
                            fVar140 = auVar82._8_4_;
                            auVar187._8_4_ = fVar140 * fVar263;
                            fVar170 = auVar82._12_4_;
                            auVar187._12_4_ = fVar170 * fVar265;
                            auVar82 = vsubps_avx(auVar187,auVar290);
                            auVar92 = vsubps_avx(auVar92,auVar251);
                            fVar289 = auVar92._0_4_;
                            auVar158._0_4_ = fVar289 * fVar143;
                            fVar292 = auVar92._4_4_;
                            auVar158._4_4_ = fVar292 * fVar171;
                            fVar294 = auVar92._8_4_;
                            auVar158._8_4_ = fVar294 * fVar263;
                            fVar296 = auVar92._12_4_;
                            auVar158._12_4_ = fVar296 * fVar265;
                            fVar143 = fVar271 + auVar251._0_4_;
                            fVar171 = fVar273 + auVar251._4_4_;
                            fVar263 = fVar278 + auVar251._8_4_;
                            fVar265 = fVar280 + auVar251._12_4_;
                            auVar258._0_4_ = fVar143 * fVar238;
                            auVar258._4_4_ = fVar171 * fVar239;
                            auVar258._8_4_ = fVar263 * fVar264;
                            auVar258._12_4_ = fVar265 * fVar266;
                            auVar92 = vsubps_avx(auVar258,auVar158);
                            auVar220._0_4_ = fVar143 * fVar214;
                            auVar220._4_4_ = fVar171 * fVar138;
                            auVar220._8_4_ = fVar263 * fVar140;
                            auVar220._12_4_ = fVar265 * fVar170;
                            auVar113._0_4_ = fVar289 * fVar250;
                            auVar113._4_4_ = fVar292 * fVar262;
                            auVar113._8_4_ = fVar294 * fVar249;
                            auVar113._12_4_ = fVar296 * fVar261;
                            auVar230 = vsubps_avx(auVar113,auVar220);
                            auVar259._0_4_ =
                                 fVar175 * auVar82._0_4_ +
                                 fVar51 * auVar230._0_4_ + fVar104 * auVar92._0_4_;
                            auVar259._4_4_ =
                                 fVar202 * auVar82._4_4_ +
                                 fVar83 * auVar230._4_4_ + fVar122 * auVar92._4_4_;
                            auVar259._8_4_ =
                                 fVar215 * auVar82._8_4_ +
                                 fVar200 * auVar230._8_4_ + fVar211 * auVar92._8_4_;
                            auVar259._12_4_ =
                                 fVar225 * auVar82._12_4_ +
                                 fVar209 * auVar230._12_4_ + fVar213 * auVar92._12_4_;
                            auVar82 = vsubps_avx(auVar251,auVar52);
                            fVar171 = auVar251._0_4_ + auVar52._0_4_;
                            fVar263 = auVar251._4_4_ + auVar52._4_4_;
                            fVar265 = auVar251._8_4_ + auVar52._8_4_;
                            fVar141 = auVar251._12_4_ + auVar52._12_4_;
                            auVar92 = vsubps_avx(auVar19,auVar95);
                            fVar144 = auVar19._0_4_ + auVar95._0_4_;
                            fVar172 = auVar19._4_4_ + auVar95._4_4_;
                            fVar174 = auVar19._8_4_ + auVar95._8_4_;
                            fVar176 = auVar19._12_4_ + auVar95._12_4_;
                            auVar95 = vsubps_avx(auVar20,auVar91);
                            fVar250 = auVar20._0_4_ + auVar91._0_4_;
                            fVar262 = auVar20._4_4_ + auVar91._4_4_;
                            fVar249 = auVar20._8_4_ + auVar91._8_4_;
                            fVar261 = auVar20._12_4_ + auVar91._12_4_;
                            fVar272 = auVar95._0_4_;
                            auVar188._0_4_ = fVar272 * fVar144;
                            fVar277 = auVar95._4_4_;
                            auVar188._4_4_ = fVar277 * fVar172;
                            fVar279 = auVar95._8_4_;
                            auVar188._8_4_ = fVar279 * fVar174;
                            fVar281 = auVar95._12_4_;
                            auVar188._12_4_ = fVar281 * fVar176;
                            fVar123 = auVar92._0_4_;
                            auVar221._0_4_ = fVar123 * fVar250;
                            fVar139 = auVar92._4_4_;
                            auVar221._4_4_ = fVar139 * fVar262;
                            fVar142 = auVar92._8_4_;
                            auVar221._8_4_ = fVar142 * fVar249;
                            fVar173 = auVar92._12_4_;
                            auVar221._12_4_ = fVar173 * fVar261;
                            auVar95 = vsubps_avx(auVar221,auVar188);
                            fVar143 = auVar82._0_4_;
                            auVar93._0_4_ = fVar143 * fVar250;
                            fVar250 = auVar82._4_4_;
                            auVar93._4_4_ = fVar250 * fVar262;
                            fVar262 = auVar82._8_4_;
                            auVar93._8_4_ = fVar262 * fVar249;
                            fVar249 = auVar82._12_4_;
                            auVar93._12_4_ = fVar249 * fVar261;
                            auVar222._0_4_ = fVar272 * fVar171;
                            auVar222._4_4_ = fVar277 * fVar263;
                            auVar222._8_4_ = fVar279 * fVar265;
                            auVar222._12_4_ = fVar281 * fVar141;
                            auVar82 = vsubps_avx(auVar222,auVar93);
                            auVar131._0_4_ = fVar171 * fVar123;
                            auVar131._4_4_ = fVar263 * fVar139;
                            auVar131._8_4_ = fVar265 * fVar142;
                            auVar131._12_4_ = fVar141 * fVar173;
                            auVar159._0_4_ = fVar143 * fVar144;
                            auVar159._4_4_ = fVar250 * fVar172;
                            auVar159._8_4_ = fVar262 * fVar174;
                            auVar159._12_4_ = fVar249 * fVar176;
                            auVar91 = vsubps_avx(auVar159,auVar131);
                            auVar94._0_4_ =
                                 fVar175 * auVar95._0_4_ +
                                 fVar51 * auVar91._0_4_ + fVar104 * auVar82._0_4_;
                            auVar94._4_4_ =
                                 fVar202 * auVar95._4_4_ +
                                 fVar83 * auVar91._4_4_ + fVar122 * auVar82._4_4_;
                            auVar94._8_4_ =
                                 fVar215 * auVar95._8_4_ +
                                 fVar200 * auVar91._8_4_ + fVar211 * auVar82._8_4_;
                            auVar94._12_4_ =
                                 fVar225 * auVar95._12_4_ +
                                 fVar209 * auVar91._12_4_ + fVar213 * auVar82._12_4_;
                            auVar223._0_4_ = auVar94._0_4_ + auVar269._0_4_ + auVar259._0_4_;
                            auVar223._4_4_ = auVar94._4_4_ + auVar269._4_4_ + auVar259._4_4_;
                            auVar223._8_4_ = auVar94._8_4_ + auVar269._8_4_ + auVar259._8_4_;
                            auVar223._12_4_ = auVar94._12_4_ + auVar269._12_4_ + auVar259._12_4_;
                            auVar82 = vminps_avx(auVar269,auVar259);
                            auVar95 = vminps_avx(auVar82,auVar94);
                            auVar283._8_4_ = 0x7fffffff;
                            auVar283._0_8_ = 0x7fffffff7fffffff;
                            auVar283._12_4_ = 0x7fffffff;
                            auVar82 = vandps_avx(auVar223,auVar283);
                            auVar160._0_4_ = auVar82._0_4_ * 1.1920929e-07;
                            auVar160._4_4_ = auVar82._4_4_ * 1.1920929e-07;
                            auVar160._8_4_ = auVar82._8_4_ * 1.1920929e-07;
                            auVar160._12_4_ = auVar82._12_4_ * 1.1920929e-07;
                            uVar45 = CONCAT44(auVar160._4_4_,auVar160._0_4_);
                            auVar189._0_8_ = uVar45 ^ 0x8000000080000000;
                            auVar189._8_4_ = -auVar160._8_4_;
                            auVar189._12_4_ = -auVar160._12_4_;
                            auVar95 = vcmpps_avx(auVar95,auVar189,5);
                            auVar91 = vmaxps_avx(auVar269,auVar259);
                            auVar91 = vmaxps_avx(auVar91,auVar94);
                            auVar91 = vcmpps_avx(auVar91,auVar160,2);
                            auVar95 = vorps_avx(auVar95,auVar91);
                            auVar91 = auVar81 & auVar95;
                            if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar91 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar91[0xf]) {
                              auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                            }
                            else {
                              auVar132._0_4_ = fVar214 * fVar282;
                              auVar132._4_4_ = fVar138 * fVar284;
                              auVar132._8_4_ = fVar140 * fVar286;
                              auVar132._12_4_ = fVar170 * fVar287;
                              auVar161._0_4_ = fVar177 * fVar238;
                              auVar161._4_4_ = fVar201 * fVar239;
                              auVar161._8_4_ = fVar210 * fVar264;
                              auVar161._12_4_ = fVar212 * fVar266;
                              auVar230 = vsubps_avx(auVar161,auVar132);
                              auVar190._0_4_ = fVar123 * fVar238;
                              auVar190._4_4_ = fVar139 * fVar239;
                              auVar190._8_4_ = fVar142 * fVar264;
                              auVar190._12_4_ = fVar173 * fVar266;
                              auVar224._0_4_ = fVar214 * fVar272;
                              auVar224._4_4_ = fVar138 * fVar277;
                              auVar224._8_4_ = fVar140 * fVar279;
                              auVar224._12_4_ = fVar170 * fVar281;
                              auVar231 = vsubps_avx(auVar224,auVar190);
                              auVar91 = vandps_avx(auVar283,auVar132);
                              auVar92 = vandps_avx(auVar283,auVar190);
                              auVar91 = vcmpps_avx(auVar91,auVar92,1);
                              aVar17 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                       vblendvps_avx(auVar231,auVar230,auVar91);
                              auVar133._0_4_ = fVar289 * fVar272;
                              auVar133._4_4_ = fVar292 * fVar277;
                              auVar133._8_4_ = fVar294 * fVar279;
                              auVar133._12_4_ = fVar296 * fVar281;
                              auVar162._0_4_ = fVar289 * fVar282;
                              auVar162._4_4_ = fVar292 * fVar284;
                              auVar162._8_4_ = fVar294 * fVar286;
                              auVar162._12_4_ = fVar296 * fVar287;
                              auVar191._0_4_ = fVar226 * fVar238;
                              auVar191._4_4_ = fVar228 * fVar239;
                              auVar191._8_4_ = fVar227 * fVar264;
                              auVar191._12_4_ = fVar229 * fVar266;
                              auVar230 = vsubps_avx(auVar162,auVar191);
                              auVar74._0_4_ = fVar143 * fVar238;
                              auVar74._4_4_ = fVar250 * fVar239;
                              auVar74._8_4_ = fVar262 * fVar264;
                              auVar74._12_4_ = fVar249 * fVar266;
                              auVar231 = vsubps_avx(auVar74,auVar133);
                              auVar91 = vandps_avx(auVar283,auVar191);
                              auVar92 = vandps_avx(auVar283,auVar133);
                              auVar91 = vcmpps_avx(auVar91,auVar92,1);
                              auVar230 = vblendvps_avx(auVar231,auVar230,auVar91);
                              auVar75._0_4_ = fVar214 * fVar143;
                              auVar75._4_4_ = fVar138 * fVar250;
                              auVar75._8_4_ = fVar140 * fVar262;
                              auVar75._12_4_ = fVar170 * fVar249;
                              auVar114._0_4_ = fVar214 * fVar226;
                              auVar114._4_4_ = fVar138 * fVar228;
                              auVar114._8_4_ = fVar140 * fVar227;
                              auVar114._12_4_ = fVar170 * fVar229;
                              auVar134._0_4_ = fVar289 * fVar177;
                              auVar134._4_4_ = fVar292 * fVar201;
                              auVar134._8_4_ = fVar294 * fVar210;
                              auVar134._12_4_ = fVar296 * fVar212;
                              auVar163._0_4_ = fVar289 * fVar123;
                              auVar163._4_4_ = fVar292 * fVar139;
                              auVar163._8_4_ = fVar294 * fVar142;
                              auVar163._12_4_ = fVar296 * fVar173;
                              auVar231 = vsubps_avx(auVar114,auVar134);
                              auVar251 = vsubps_avx(auVar163,auVar75);
                              auVar91 = vandps_avx(auVar283,auVar134);
                              auVar92 = vandps_avx(auVar283,auVar75);
                              auVar91 = vcmpps_avx(auVar91,auVar92,1);
                              auVar91 = vblendvps_avx(auVar251,auVar231,auVar91);
                              local_1c48 = auVar285._0_4_;
                              fStack_1c44 = auVar285._4_4_;
                              fStack_1c40 = auVar285._8_4_;
                              local_1bd8 = auVar27._0_4_;
                              fStack_1bd4 = auVar27._4_4_;
                              fStack_1bd0 = auVar27._8_4_;
                              fVar51 = aVar17.v[0] * fVar175 +
                                       auVar91._0_4_ * local_1c48 + auVar230._0_4_ * local_1bd8;
                              fVar83 = aVar17.v[1] * fVar202 +
                                       auVar91._4_4_ * fStack_1c44 + auVar230._4_4_ * fStack_1bd4;
                              fVar200 = aVar17.v[2] * fVar215 +
                                        auVar91._8_4_ * fStack_1c40 + auVar230._8_4_ * fStack_1bd0;
                              fVar209 = aVar17.v[3] * fVar225 +
                                        auVar91._12_4_ * fVar209 + auVar230._12_4_ * fVar213;
                              auVar76._0_4_ = fVar51 + fVar51;
                              auVar76._4_4_ = fVar83 + fVar83;
                              auVar76._8_4_ = fVar200 + fVar200;
                              auVar76._12_4_ = fVar209 + fVar209;
                              fVar51 = aVar17.v[0] * fVar271 +
                                       auVar91._0_4_ * fVar288 + auVar230._0_4_ * fVar240;
                              fVar83 = aVar17.v[1] * fVar273 +
                                       auVar91._4_4_ * fVar291 + auVar230._4_4_ * fVar246;
                              fVar200 = aVar17.v[2] * fVar278 +
                                        auVar91._8_4_ * fVar293 + auVar230._8_4_ * fVar247;
                              fVar209 = aVar17.v[3] * fVar280 +
                                        auVar91._12_4_ * fVar295 + auVar230._12_4_ * fVar248;
                              auVar91 = vrcpps_avx(auVar76);
                              fVar240 = auVar91._0_4_;
                              auVar164._0_4_ = auVar76._0_4_ * fVar240;
                              fVar246 = auVar91._4_4_;
                              auVar164._4_4_ = auVar76._4_4_ * fVar246;
                              fVar247 = auVar91._8_4_;
                              auVar164._8_4_ = auVar76._8_4_ * fVar247;
                              fVar248 = auVar91._12_4_;
                              auVar164._12_4_ = auVar76._12_4_ * fVar248;
                              auVar192._8_4_ = 0x3f800000;
                              auVar192._0_8_ = 0x3f8000003f800000;
                              auVar192._12_4_ = 0x3f800000;
                              auVar91 = vsubps_avx(auVar192,auVar164);
                              auVar135._0_4_ =
                                   (fVar51 + fVar51) * (fVar240 + fVar240 * auVar91._0_4_);
                              auVar135._4_4_ =
                                   (fVar83 + fVar83) * (fVar246 + fVar246 * auVar91._4_4_);
                              auVar135._8_4_ =
                                   (fVar200 + fVar200) * (fVar247 + fVar247 * auVar91._8_4_);
                              auVar135._12_4_ =
                                   (fVar209 + fVar209) * (fVar248 + fVar248 * auVar91._12_4_);
                              auVar91 = vcmpps_avx(auVar135,*(undefined1 (*) [16])(ray + 0x80),2);
                              auVar92 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar135,2);
                              auVar91 = vandps_avx(auVar92,auVar91);
                              auVar92 = vcmpps_avx(auVar76,ZEXT816(0) << 0x20,4);
                              auVar91 = vandps_avx(auVar92,auVar91);
                              auVar92 = vandps_avx(auVar81,auVar95);
                              auVar95 = vpslld_avx(auVar91,0x1f);
                              auVar95 = vpsrad_avx(auVar95,0x1f);
                              auVar91 = auVar92 & auVar95;
                              auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar91 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || auVar91[0xf] < '\0') {
                                auVar95 = vandps_avx(auVar95,auVar92);
                                uVar9 = *(uint *)((long)&local_1998 + uVar44 * 4);
                                pGVar12 = (context->scene->geometries).items[uVar9].ptr;
                                uVar30 = pGVar12->mask;
                                auVar96._4_4_ = uVar30;
                                auVar96._0_4_ = uVar30;
                                auVar96._8_4_ = uVar30;
                                auVar96._12_4_ = uVar30;
                                auVar91 = vandps_avx(auVar96,*(undefined1 (*) [16])(ray + 0x90));
                                auVar91 = vpcmpeqd_avx(auVar91,ZEXT816(0) << 0x20);
                                auVar103 = ZEXT1664(auVar91);
                                auVar92 = auVar95 & ~auVar91;
                                auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar92 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar92 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar92[0xf] < '\0') {
                                  uVar30 = *(uint *)((long)&local_19a8 + uVar44 * 4);
                                  aVar101 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                            vandnps_avx(auVar91,auVar95);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar92 = vsubps_avx(auVar223,auVar269);
                                    auVar230 = vsubps_avx(auVar223,auVar259);
                                    auVar165._0_4_ =
                                         (float)(int)(*(ushort *)(lVar13 + 8 + lVar34) - 1);
                                    auVar285 = auVar283._4_12_;
                                    auVar165._4_12_ = auVar285;
                                    auVar124 = vrcpss_avx(auVar165,auVar165);
                                    auVar199._0_4_ =
                                         (float)(int)(*(ushort *)(lVar13 + 10 + lVar34) - 1);
                                    auVar199._4_12_ = auVar285;
                                    auVar194._0_4_ = (float)(((uint)uVar44 & 1) + uVar42);
                                    auVar194._4_12_ = auVar285;
                                    auVar91 = vshufps_avx(auVar194,auVar194,0);
                                    auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                             (2.0 - auVar124._0_4_ * auVar165._0_4_)
                                                             ));
                                    auVar124 = vshufps_avx(auVar124,auVar124,0);
                                    auVar166._0_4_ =
                                         (auVar92._0_4_ + auVar223._0_4_ * auVar91._0_4_) *
                                         auVar124._0_4_;
                                    auVar166._4_4_ =
                                         (auVar92._4_4_ + auVar223._4_4_ * auVar91._4_4_) *
                                         auVar124._4_4_;
                                    auVar166._8_4_ =
                                         (auVar92._8_4_ + auVar223._8_4_ * auVar91._8_4_) *
                                         auVar124._8_4_;
                                    auVar166._12_4_ =
                                         (auVar92._12_4_ + auVar223._12_4_ * auVar91._12_4_) *
                                         auVar124._12_4_;
                                    auVar124 = vrcpss_avx(auVar199,auVar199);
                                    auVar91 = vblendvps_avx(auVar92,auVar166,auVar95);
                                    auVar195._0_4_ =
                                         (float)(int)(((uint)(uVar44 >> 1) & 0x7fffffff) + uVar43);
                                    auVar195._4_12_ = auVar285;
                                    auVar92 = vshufps_avx(auVar195,auVar195,0);
                                    auVar124 = ZEXT416((uint)(auVar124._0_4_ *
                                                             (2.0 - auVar124._0_4_ * auVar199._0_4_)
                                                             ));
                                    auVar124 = vshufps_avx(auVar124,auVar124,0);
                                    auVar167._0_4_ =
                                         (auVar230._0_4_ + auVar223._0_4_ * auVar92._0_4_) *
                                         auVar124._0_4_;
                                    auVar167._4_4_ =
                                         (auVar230._4_4_ + auVar223._4_4_ * auVar92._4_4_) *
                                         auVar124._4_4_;
                                    auVar167._8_4_ =
                                         (auVar230._8_4_ + auVar223._8_4_ * auVar92._8_4_) *
                                         auVar124._8_4_;
                                    auVar167._12_4_ =
                                         (auVar230._12_4_ + auVar223._12_4_ * auVar92._12_4_) *
                                         auVar124._12_4_;
                                    auVar95 = vblendvps_avx(auVar230,auVar167,auVar95);
                                    auVar124 = vrcpps_avx(auVar223);
                                    fVar240 = auVar124._0_4_;
                                    auVar168._0_4_ = auVar223._0_4_ * fVar240;
                                    fVar246 = auVar124._4_4_;
                                    auVar168._4_4_ = auVar223._4_4_ * fVar246;
                                    fVar247 = auVar124._8_4_;
                                    auVar168._8_4_ = auVar223._8_4_ * fVar247;
                                    fVar248 = auVar124._12_4_;
                                    auVar168._12_4_ = auVar223._12_4_ * fVar248;
                                    auVar196._8_4_ = 0x3f800000;
                                    auVar196._0_8_ = 0x3f8000003f800000;
                                    auVar196._12_4_ = 0x3f800000;
                                    auVar124 = vsubps_avx(auVar196,auVar168);
                                    auVar100._0_4_ = fVar240 + fVar240 * auVar124._0_4_;
                                    auVar100._4_4_ = fVar246 + fVar246 * auVar124._4_4_;
                                    auVar100._8_4_ = fVar247 + fVar247 * auVar124._8_4_;
                                    auVar100._12_4_ = fVar248 + fVar248 * auVar124._12_4_;
                                    auVar169._8_4_ = 0x219392ef;
                                    auVar169._0_8_ = 0x219392ef219392ef;
                                    auVar169._12_4_ = 0x219392ef;
                                    auVar124 = vcmpps_avx(auVar82,auVar169,5);
                                    auVar124 = vandps_avx(auVar124,auVar100);
                                    auVar118._0_4_ = auVar91._0_4_ * auVar124._0_4_;
                                    auVar118._4_4_ = auVar91._4_4_ * auVar124._4_4_;
                                    auVar118._8_4_ = auVar91._8_4_ * auVar124._8_4_;
                                    auVar118._12_4_ = auVar91._12_4_ * auVar124._12_4_;
                                    vminps_avx(auVar118,auVar196);
                                    auVar80._0_4_ = auVar95._0_4_ * auVar124._0_4_;
                                    auVar80._4_4_ = auVar95._4_4_ * auVar124._4_4_;
                                    auVar80._8_4_ = auVar95._8_4_ * auVar124._8_4_;
                                    auVar80._12_4_ = auVar95._12_4_ * auVar124._12_4_;
                                    vminps_avx(auVar80,auVar196);
                                    lower_y.field_0._0_8_ = &upper_y;
                                    lower_y.field_0._8_8_ = &t;
                                    upper_x.field_0 = aVar17;
                                    std::
                                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                    ::
                                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                *)&lower_y,
                                               (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                *)&upper_x);
                                    auVar124 = vpshufd_avx(ZEXT416(uVar9),0);
                                    auVar82 = ZEXT416(uVar30);
                                    vshufps_avx(auVar82,auVar82,0);
                                    upper_x.field_0.v[1] = (float)upper_y.field_0.i[1];
                                    upper_x.field_0.v[0] = (float)upper_y.field_0.i[0];
                                    upper_x.field_0.v[3] = (float)upper_y.field_0.i[3];
                                    upper_x.field_0.v[2] = (float)upper_y.field_0.i[2];
                                    vcmpps_avx(ZEXT1632(auVar124),ZEXT1632(auVar124),0xf);
                                    auVar124 = *(undefined1 (*) [16])(ray + 0x80);
                                    auVar82 = vblendvps_avx(auVar124,(undefined1  [16])t.field_0,
                                                            (undefined1  [16])aVar101);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar82;
                                    lower_z.field_0 = aVar101;
                                    lower_y.field_0._0_8_ = &lower_z;
                                    lower_y.field_0._8_8_ = pGVar12->userPtr;
                                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar12->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&lower_y);
                                    }
                                    if (lower_z.field_0 ==
                                        (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                      auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                                      auVar82 = auVar82 ^ _DAT_01f46b70;
                                      auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                      auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                    CONCAT48(0x3f7ffffa,
                                                                             0x3f7ffffa3f7ffffa)));
                                      auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                    CONCAT48(0x3f800003,
                                                                             0x3f8000033f800003)));
                                    }
                                    else {
                                      p_Var15 = context->args->filter;
                                      if (p_Var15 == (RTCFilterFunctionN)0x0) {
                                        auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                        auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                      CONCAT48(0x3f7ffffa,
                                                                               0x3f7ffffa3f7ffffa)))
                                        ;
                                        auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                      CONCAT48(0x3f800003,
                                                                               0x3f8000033f800003)))
                                        ;
                                      }
                                      else {
                                        auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                        auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                      CONCAT48(0x3f7ffffa,
                                                                               0x3f7ffffa3f7ffffa)))
                                        ;
                                        auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                      CONCAT48(0x3f800003,
                                                                               0x3f8000033f800003)))
                                        ;
                                        if (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                           (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                          (*p_Var15)((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                                        CONCAT48(0x3f800003,
                                                                                 0x3f8000033f800003)
                                                                       ));
                                          auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ));
                                          auVar260 = ZEXT1664(CONCAT412(0x7f800000,
                                                                        CONCAT48(0x7f800000,
                                                                                 0x7f8000007f800000)
                                                                       ));
                                        }
                                      }
                                      auVar95 = vpcmpeqd_avx((undefined1  [16])lower_z.field_0,
                                                             _DAT_01f45a50);
                                      auVar82 = auVar95 ^ _DAT_01f46b70;
                                      auVar120._8_4_ = 0xff800000;
                                      auVar120._0_8_ = 0xff800000ff800000;
                                      auVar120._12_4_ = 0xff800000;
                                      auVar95 = vblendvps_avx(auVar120,*(undefined1 (*) [16])
                                                                        (ray + 0x80),auVar95);
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar95;
                                    }
                                    auVar82 = vpslld_avx(auVar82,0x1f);
                                    aVar101 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                              vpsrad_avx(auVar82,0x1f);
                                    auVar124 = vblendvps_avx(auVar124,*(undefined1 (*) [16])pRVar1,
                                                             auVar82);
                                    *(undefined1 (*) [16])pRVar1 = auVar124;
                                  }
                                  auVar103 = ZEXT1664((undefined1  [16])aVar101);
                                  auVar124 = vpandn_avx((undefined1  [16])aVar101,auVar81);
                                }
                                goto LAB_00ed7e95;
                              }
                            }
                            auVar103 = ZEXT1664(auVar95);
                            auVar270 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
LAB_00ed7e95:
                          uVar44 = uVar44 + 1;
                          puVar46 = puVar46 + 8;
                        } while ((((auVar124 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0 ||
                                  (auVar124 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                                 (auVar124 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || auVar124[0xf] < '\0');
                        auVar145 = auVar60 & auVar124;
                        bVar50 = (((auVar145 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0 &&
                                  (auVar145 >> 0x3f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar145 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && -1 < auVar145[0xf];
                        auVar60 = vandps_avx(auVar124,auVar60);
                      }
                      auVar276 = ZEXT1664(auVar60);
                    } while ((!bVar50) && (uVar40 = uVar40 & uVar40 - 1, uVar40 != 0));
                  }
                }
                auVar60 = vpcmpeqd_avx(auVar103._0_16_,auVar103._0_16_);
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar276._0_16_ ^ auVar60,(undefined1  [16])terminated.field_0);
                auVar60 = auVar60 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar60[0xf]) goto LAB_00ed8198;
                auVar103 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar121._8_4_ = 0xff800000;
                auVar121._0_8_ = 0xff800000ff800000;
                auVar121._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar121,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00ed6654;
            }
            sVar35 = 8;
            auVar60 = auVar260._0_16_;
            for (lVar33 = 0;
                (auVar276 = ZEXT1664(auVar60), lVar33 != 4 &&
                (sVar11 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar33 * 8), sVar11 != 8));
                lVar33 = lVar33 + 1) {
              uVar31 = *(undefined4 *)(root.ptr + 0x20 + lVar33 * 4);
              auVar52._4_4_ = uVar31;
              auVar52._0_4_ = uVar31;
              auVar52._8_4_ = uVar31;
              auVar52._12_4_ = uVar31;
              auVar105._8_8_ = tray.org.field_0._8_8_;
              auVar105._0_8_ = tray.org.field_0._0_8_;
              auVar19._8_8_ = tray.org.field_0._24_8_;
              auVar19._0_8_ = tray.org.field_0._16_8_;
              auVar20._8_8_ = tray.org.field_0._40_8_;
              auVar20._0_8_ = tray.org.field_0._32_8_;
              auVar124 = vsubps_avx(auVar52,auVar105);
              auVar178._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar124._0_4_;
              auVar178._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar124._4_4_;
              auVar178._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar124._8_4_;
              auVar178._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar124._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x40 + lVar33 * 4);
              auVar53._4_4_ = uVar31;
              auVar53._0_4_ = uVar31;
              auVar53._8_4_ = uVar31;
              auVar53._12_4_ = uVar31;
              auVar124 = vsubps_avx(auVar53,auVar19);
              auVar203._0_4_ = tray.rdir.field_0._16_4_ * auVar124._0_4_;
              auVar203._4_4_ = tray.rdir.field_0._20_4_ * auVar124._4_4_;
              auVar203._8_4_ = tray.rdir.field_0._24_4_ * auVar124._8_4_;
              auVar203._12_4_ = tray.rdir.field_0._28_4_ * auVar124._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x60 + lVar33 * 4);
              auVar54._4_4_ = uVar31;
              auVar54._0_4_ = uVar31;
              auVar54._8_4_ = uVar31;
              auVar54._12_4_ = uVar31;
              auVar124 = vsubps_avx(auVar54,auVar20);
              auVar232._0_4_ = tray.rdir.field_0._32_4_ * auVar124._0_4_;
              auVar232._4_4_ = tray.rdir.field_0._36_4_ * auVar124._4_4_;
              auVar232._8_4_ = tray.rdir.field_0._40_4_ * auVar124._8_4_;
              auVar232._12_4_ = tray.rdir.field_0._44_4_ * auVar124._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x30 + lVar33 * 4);
              auVar55._4_4_ = uVar31;
              auVar55._0_4_ = uVar31;
              auVar55._8_4_ = uVar31;
              auVar55._12_4_ = uVar31;
              auVar124 = vsubps_avx(auVar55,auVar105);
              auVar84._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar124._0_4_;
              auVar84._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar124._4_4_;
              auVar84._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar124._8_4_;
              auVar84._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar124._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x50 + lVar33 * 4);
              auVar56._4_4_ = uVar31;
              auVar56._0_4_ = uVar31;
              auVar56._8_4_ = uVar31;
              auVar56._12_4_ = uVar31;
              auVar124 = vsubps_avx(auVar56,auVar19);
              auVar106._0_4_ = tray.rdir.field_0._16_4_ * auVar124._0_4_;
              auVar106._4_4_ = tray.rdir.field_0._20_4_ * auVar124._4_4_;
              auVar106._8_4_ = tray.rdir.field_0._24_4_ * auVar124._8_4_;
              auVar106._12_4_ = tray.rdir.field_0._28_4_ * auVar124._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x70 + lVar33 * 4);
              auVar57._4_4_ = uVar31;
              auVar57._0_4_ = uVar31;
              auVar57._8_4_ = uVar31;
              auVar57._12_4_ = uVar31;
              auVar124 = vsubps_avx(auVar57,auVar20);
              auVar125._0_4_ = tray.rdir.field_0._32_4_ * auVar124._0_4_;
              auVar125._4_4_ = tray.rdir.field_0._36_4_ * auVar124._4_4_;
              auVar125._8_4_ = tray.rdir.field_0._40_4_ * auVar124._8_4_;
              auVar125._12_4_ = tray.rdir.field_0._44_4_ * auVar124._12_4_;
              auVar124 = vminps_avx(auVar178,auVar84);
              auVar145 = vminps_avx(auVar203,auVar106);
              auVar124 = vmaxps_avx(auVar124,auVar145);
              auVar145 = vminps_avx(auVar232,auVar125);
              auVar124 = vmaxps_avx(auVar124,auVar145);
              auVar58._0_4_ = auVar245._0_4_ * auVar124._0_4_;
              auVar58._4_4_ = auVar245._4_4_ * auVar124._4_4_;
              auVar58._8_4_ = auVar245._8_4_ * auVar124._8_4_;
              auVar58._12_4_ = auVar245._12_4_ * auVar124._12_4_;
              auVar124 = vmaxps_avx(auVar178,auVar84);
              auVar145 = vmaxps_avx(auVar203,auVar106);
              auVar145 = vminps_avx(auVar124,auVar145);
              auVar124 = vmaxps_avx(auVar232,auVar125);
              auVar124 = vminps_avx(auVar145,auVar124);
              auVar85._0_4_ = auVar270._0_4_ * auVar124._0_4_;
              auVar85._4_4_ = auVar270._4_4_ * auVar124._4_4_;
              auVar85._8_4_ = auVar270._8_4_ * auVar124._8_4_;
              auVar85._12_4_ = auVar270._12_4_ * auVar124._12_4_;
              auVar124 = vmaxps_avx(auVar58,(undefined1  [16])tray.tnear.field_0);
              auVar145 = vminps_avx(auVar85,(undefined1  [16])tray.tfar.field_0);
              auVar145 = vcmpps_avx(auVar124,auVar145,2);
              auVar103 = ZEXT1664(auVar145);
              sVar29 = sVar35;
              auVar124 = auVar60;
              if (((((auVar145 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar145 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar145 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar145[0xf] < '\0') &&
                 (auVar124 = vblendvps_avx(auVar260._0_16_,auVar58,auVar145), sVar29 = sVar11,
                 sVar35 != 8)) {
                pNVar47->ptr = sVar35;
                pNVar47 = pNVar47 + 1;
                *(undefined1 (*) [16])paVar38->v = auVar60;
                paVar38 = paVar38 + 1;
              }
              auVar60 = auVar124;
              sVar35 = sVar29;
            }
            if (sVar35 == 8) goto LAB_00ed6818;
            auVar124 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar60,6);
            uVar31 = vmovmskps_avx(auVar124);
            root.ptr = sVar35;
          } while ((byte)uVar39 < (byte)POPCOUNT(uVar31));
          pNVar47->ptr = sVar35;
          pNVar47 = pNVar47 + 1;
          *(undefined1 (*) [16])paVar38->v = auVar60;
          paVar38 = paVar38 + 1;
LAB_00ed6818:
          iVar32 = 4;
        }
        else {
          while (uVar49 != 0) {
            sVar35 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> sVar35 & 1) == 0; sVar35 = sVar35 + 1) {
              }
            }
            uVar49 = uVar49 & uVar49 - 1;
            auVar103 = ZEXT1664(auVar103._0_16_);
            bVar50 = occluded1(This,bvh,root,sVar35,&pre,ray,&tray,context);
            if (bVar50) {
              terminated.field_0.i[sVar35] = -1;
            }
          }
          auVar60 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar32 = 3;
          auVar260 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar245 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar270 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar276 = ZEXT1664((undefined1  [16])vVar6.field_0);
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            auVar103 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar60._8_4_ = 0xff800000;
            auVar60._0_8_ = 0xff800000ff800000;
            auVar60._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar60,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
          if (uVar39 < uVar30) goto LAB_00ed6698;
        }
      } while (iVar32 != 3);
LAB_00ed8198:
      auVar18 = vandps_avx(auVar18,(undefined1  [16])terminated.field_0);
      auVar102._8_4_ = 0xff800000;
      auVar102._0_8_ = 0xff800000ff800000;
      auVar102._12_4_ = 0xff800000;
      auVar18 = vmaskmovps_avx(auVar18,auVar102);
      *(undefined1 (*) [16])pRVar1 = auVar18;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }